

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_rateallocate
                   (opj_tcd_t *tcd,OPJ_BYTE *dest,OPJ_UINT32 *p_data_written,OPJ_UINT32 len,
                   opj_codestream_info_t *cstr_info,opj_event_mgr_t *p_manager)

{
  opj_cp_t *p_cp;
  opj_tcd_tile_t *p_tile;
  opj_tcp_t *poVar1;
  opj_tcd_tilecomp_t *poVar2;
  opj_tcd_resolution_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  opj_tcd_cblk_enc_t *poVar5;
  double dVar6;
  double dVar7;
  OPJ_FLOAT64 OVar8;
  OPJ_BOOL OVar9;
  opj_tcd_pass_t *poVar10;
  opj_tile_info_t *poVar11;
  double *pdVar12;
  opj_t2_t *t2_00;
  double dVar13;
  double dVar14;
  OPJ_FLOAT64 OVar15;
  OPJ_FLOAT64 local_4b8;
  OPJ_FLOAT64 local_4b0;
  OPJ_UINT32 local_484;
  OPJ_FLOAT64 distoachieved;
  OPJ_FLOAT64 thresh;
  opj_t2_t *t2;
  OPJ_FLOAT64 distotarget;
  double dStack_458;
  OPJ_UINT32 i;
  OPJ_FLOAT64 stable_thresh;
  OPJ_FLOAT64 goodthresh;
  double dStack_440;
  OPJ_UINT32 maxlen;
  OPJ_FLOAT64 hi;
  OPJ_FLOAT64 lo;
  opj_tile_info_t *tile_info;
  OPJ_FLOAT64 rdslope;
  OPJ_FLOAT64 dd;
  OPJ_INT32 dr;
  opj_tcd_pass_t *pass;
  opj_tcd_cblk_enc_t *cblk;
  opj_tcd_precinct_t *prc;
  opj_tcd_band_t *band;
  opj_tcd_resolution_t *res;
  opj_tcd_tilecomp_t *tilec;
  opj_tcp_t *tcd_tcp;
  opj_tcd_tile_t *tcd_tile;
  opj_cp_t *cp;
  OPJ_FLOAT64 maxSE;
  OPJ_FLOAT64 K;
  OPJ_FLOAT64 cumdisto [100];
  double local_90;
  OPJ_FLOAT64 max;
  OPJ_FLOAT64 min;
  uint local_78;
  OPJ_UINT32 passno;
  OPJ_UINT32 layno;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 precno;
  OPJ_UINT32 bandno;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  opj_event_mgr_t *p_manager_local;
  opj_codestream_info_t *cstr_info_local;
  OPJ_UINT32 len_local;
  OPJ_UINT32 *p_data_written_local;
  OPJ_BYTE *dest_local;
  opj_tcd_t *tcd_local;
  
  cp = (opj_cp_t *)0x0;
  p_cp = tcd->cp;
  p_tile = tcd->tcd_image->tiles;
  poVar1 = tcd->tcp;
  max = 1.79769313486232e+308;
  local_90 = 0.0;
  p_tile->numpix = 0;
  for (bandno = 0; bandno < p_tile->numcomps; bandno = bandno + 1) {
    poVar2 = p_tile->comps;
    poVar2[bandno].numpix = 0;
    for (precno = 0; precno < poVar2[bandno].numresolutions; precno = precno + 1) {
      poVar3 = poVar2[bandno].resolutions;
      for (cblkno = 0; cblkno < poVar3[precno].numbands; cblkno = cblkno + 1) {
        OVar9 = opj_tcd_is_band_empty(poVar3[precno].bands + cblkno);
        if (OVar9 == 0) {
          for (layno = 0; layno < poVar3[precno].pw * poVar3[precno].ph; layno = layno + 1) {
            poVar4 = poVar3[precno].bands[cblkno].precincts;
            for (passno = 0; passno < poVar4[layno].cw * poVar4[layno].ch; passno = passno + 1) {
              poVar5 = poVar4[layno].cblks.enc;
              for (min._4_4_ = 0; min._4_4_ < poVar5[passno].totalpasses; min._4_4_ = min._4_4_ + 1)
              {
                poVar10 = poVar5[passno].passes + min._4_4_;
                if (min._4_4_ == 0) {
                  dd._4_4_ = poVar10->rate;
                  rdslope = poVar10->distortiondec;
                }
                else {
                  dd._4_4_ = poVar10->rate - poVar5[passno].passes[min._4_4_ - 1].rate;
                  rdslope = (OPJ_FLOAT64)
                            ((double)poVar10->distortiondec -
                            (double)poVar5[passno].passes[min._4_4_ - 1].distortiondec);
                }
                if (dd._4_4_ != 0) {
                  dVar13 = (double)rdslope / (double)(int)dd._4_4_;
                  if (dVar13 < (double)max) {
                    max = (OPJ_FLOAT64)dVar13;
                  }
                  if (local_90 < dVar13) {
                    local_90 = dVar13;
                  }
                }
              }
              p_tile->numpix =
                   (poVar5[passno].x1 - poVar5[passno].x0) * (poVar5[passno].y1 - poVar5[passno].y0)
                   + p_tile->numpix;
              poVar2[bandno].numpix =
                   (poVar5[passno].x1 - poVar5[passno].x0) * (poVar5[passno].y1 - poVar5[passno].y0)
                   + poVar2[bandno].numpix;
            }
          }
        }
      }
    }
    cp = (opj_cp_t *)
         (((double)(1 << ((byte)tcd->image->comps[bandno].prec & 0x1f)) - 1.0) *
          ((double)(1 << ((byte)tcd->image->comps[bandno].prec & 0x1f)) - 1.0) *
          (double)poVar2[bandno].numpix + (double)cp);
  }
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    poVar11 = cstr_info->tile + tcd->tcd_tileno;
    poVar11->numpix = p_tile->numpix;
    poVar11->distotile = (double)p_tile->distotile;
    pdVar12 = (double *)opj_malloc((ulong)poVar1->numlayers << 3);
    poVar11->thresh = pdVar12;
    if (poVar11->thresh == (double *)0x0) {
      return 0;
    }
  }
  local_78 = 0;
  do {
    if (poVar1->numlayers <= local_78) {
      return 1;
    }
    hi = max;
    dStack_440 = local_90;
    local_484 = len;
    if (0.0 < (float)poVar1->rates[local_78]) {
      dVar13 = ceil((double)(float)poVar1->rates[local_78]);
      local_484 = opj_uint_min((OPJ_UINT32)(long)dVar13,len);
    }
    dStack_458 = 0.0;
    dVar13 = (double)p_tile->distotile;
    dVar14 = pow(10.0,(double)((float)poVar1->distoratio[local_78] / 10.0));
    if ((((*(byte *)((long)&p_cp->m_specific_param + 0x11) & 1) == 1) &&
        (0.0 < (float)poVar1->rates[local_78])) ||
       (((*(byte *)((long)&p_cp->m_specific_param + 0x11) >> 2 & 1) == 1 &&
        (0.0 < (float)poVar1->distoratio[local_78])))) {
      t2_00 = opj_t2_create(tcd->image,p_cp);
      distoachieved = 0.0;
      if (t2_00 == (opj_t2_t *)0x0) {
        return 0;
      }
      for (distotarget._4_4_ = 0; distotarget._4_4_ < 0x80;
          distotarget._4_4_ = distotarget._4_4_ + 1) {
        distoachieved = (OPJ_FLOAT64)(((double)hi + dStack_440) / 2.0);
        opj_tcd_makelayer(tcd,local_78,distoachieved,0);
        dVar6 = dStack_458;
        dVar7 = dStack_440;
        if ((*(byte *)((long)&p_cp->m_specific_param + 0x11) >> 2 & 1) == 0) {
          OVar9 = opj_t2_encode_packets
                            (t2_00,tcd->tcd_tileno,p_tile,local_78 + 1,dest,p_data_written,local_484
                             ,cstr_info,tcd->cur_tp_num,tcd->tp_pos,tcd->cur_pino,THRESH_CALC,
                             p_manager);
          dStack_458 = (double)distoachieved;
          dStack_440 = (double)distoachieved;
          OVar8 = (OPJ_FLOAT64)(double)distoachieved;
          if (OVar9 != 0) goto LAB_0016029d;
        }
        else {
          if ((p_cp->rsiz < 3) || (6 < p_cp->rsiz)) {
            if (local_78 == 0) {
              OVar15 = p_tile->distolayer[0];
            }
            else {
              OVar15 = (OPJ_FLOAT64)
                       ((double)cumdisto[(ulong)(local_78 - 1) - 1] +
                       (double)p_tile->distolayer[local_78]);
            }
          }
          else {
            OVar9 = opj_t2_encode_packets
                              (t2_00,tcd->tcd_tileno,p_tile,local_78 + 1,dest,p_data_written,
                               local_484,cstr_info,tcd->cur_tp_num,tcd->tp_pos,tcd->cur_pino,
                               THRESH_CALC,p_manager);
            OVar8 = (OPJ_FLOAT64)(double)distoachieved;
            if (OVar9 == 0) goto LAB_0016029f;
            if (local_78 == 0) {
              OVar15 = p_tile->distolayer[0];
            }
            else {
              OVar15 = (OPJ_FLOAT64)
                       ((double)cumdisto[(ulong)(local_78 - 1) - 1] +
                       (double)p_tile->distolayer[local_78]);
            }
          }
          dVar6 = (double)distoachieved;
          dVar7 = (double)distoachieved;
          OVar8 = hi;
          hi = distoachieved;
          if (dVar13 - ((double)cp * 1.0) / dVar14 <= (double)OVar15) {
LAB_0016029d:
            dVar6 = dStack_458;
            dVar7 = dStack_440;
            OVar8 = hi;
          }
        }
LAB_0016029f:
        hi = OVar8;
        dStack_440 = dVar7;
        dStack_458 = dVar6;
      }
      if ((dStack_458 != 0.0) || (NAN(dStack_458))) {
        local_4b0 = (OPJ_FLOAT64)dStack_458;
      }
      else {
        local_4b0 = distoachieved;
      }
      stable_thresh = local_4b0;
      opj_t2_destroy(t2_00);
    }
    else {
      stable_thresh = -1.0;
    }
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      cstr_info->tile[tcd->tcd_tileno].thresh[local_78] = (double)stable_thresh;
    }
    opj_tcd_makelayer(tcd,local_78,stable_thresh,1);
    if (local_78 == 0) {
      local_4b8 = p_tile->distolayer[0];
    }
    else {
      local_4b8 = (OPJ_FLOAT64)
                  ((double)cumdisto[(ulong)(local_78 - 1) - 1] +
                  (double)p_tile->distolayer[local_78]);
    }
    cumdisto[(ulong)local_78 - 1] = local_4b8;
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

OPJ_BOOL opj_tcd_rateallocate(opj_tcd_t *tcd,
                              OPJ_BYTE *dest,
                              OPJ_UINT32 * p_data_written,
                              OPJ_UINT32 len,
                              opj_codestream_info_t *cstr_info,
                              opj_event_mgr_t *p_manager)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno, layno;
    OPJ_UINT32 passno;
    OPJ_FLOAT64 min, max;
    OPJ_FLOAT64 cumdisto[100];      /* fixed_quality */
    const OPJ_FLOAT64 K = 1;                /* 1.1; fixed_quality */
    OPJ_FLOAT64 maxSE = 0;

    opj_cp_t *cp = tcd->cp;
    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    opj_tcp_t *tcd_tcp = tcd->tcp;

    min = DBL_MAX;
    max = 0;

    tcd_tile->numpix = 0;           /* fixed_quality */

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];
        tilec->numpix = 0;

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];

                        for (passno = 0; passno < cblk->totalpasses; passno++) {
                            opj_tcd_pass_t *pass = &cblk->passes[passno];
                            OPJ_INT32 dr;
                            OPJ_FLOAT64 dd, rdslope;

                            if (passno == 0) {
                                dr = (OPJ_INT32)pass->rate;
                                dd = pass->distortiondec;
                            } else {
                                dr = (OPJ_INT32)(pass->rate - cblk->passes[passno - 1].rate);
                                dd = pass->distortiondec - cblk->passes[passno - 1].distortiondec;
                            }

                            if (dr == 0) {
                                continue;
                            }

                            rdslope = dd / dr;
                            if (rdslope < min) {
                                min = rdslope;
                            }

                            if (rdslope > max) {
                                max = rdslope;
                            }
                        } /* passno */

                        /* fixed_quality */
                        tcd_tile->numpix += ((cblk->x1 - cblk->x0) * (cblk->y1 - cblk->y0));
                        tilec->numpix += ((cblk->x1 - cblk->x0) * (cblk->y1 - cblk->y0));
                    } /* cbklno */
                } /* precno */
            } /* bandno */
        } /* resno */

        maxSE += (((OPJ_FLOAT64)(1 << tcd->image->comps[compno].prec) - 1.0)
                  * ((OPJ_FLOAT64)(1 << tcd->image->comps[compno].prec) - 1.0))
                 * ((OPJ_FLOAT64)(tilec->numpix));
    } /* compno */

    /* index file */
    if (cstr_info) {
        opj_tile_info_t *tile_info = &cstr_info->tile[tcd->tcd_tileno];
        tile_info->numpix = tcd_tile->numpix;
        tile_info->distotile = tcd_tile->distotile;
        tile_info->thresh = (OPJ_FLOAT64 *) opj_malloc(tcd_tcp->numlayers * sizeof(
                                OPJ_FLOAT64));
        if (!tile_info->thresh) {
            /* FIXME event manager error callback */
            return OPJ_FALSE;
        }
    }

    for (layno = 0; layno < tcd_tcp->numlayers; layno++) {
        OPJ_FLOAT64 lo = min;
        OPJ_FLOAT64 hi = max;
        OPJ_UINT32 maxlen = tcd_tcp->rates[layno] > 0.0f ? opj_uint_min(((
                                OPJ_UINT32) ceil(tcd_tcp->rates[layno])), len) : len;
        OPJ_FLOAT64 goodthresh = 0;
        OPJ_FLOAT64 stable_thresh = 0;
        OPJ_UINT32 i;
        OPJ_FLOAT64 distotarget;                /* fixed_quality */

        /* fixed_quality */
        distotarget = tcd_tile->distotile - ((K * maxSE) / pow((OPJ_FLOAT32)10,
                                             tcd_tcp->distoratio[layno] / 10));

        /* Don't try to find an optimal threshold but rather take everything not included yet, if
          -r xx,yy,zz,0   (disto_alloc == 1 and rates == 0)
          -q xx,yy,zz,0   (fixed_quality == 1 and distoratio == 0)
          ==> possible to have some lossy layers and the last layer for sure lossless */
        if (((cp->m_specific_param.m_enc.m_disto_alloc == 1) &&
                (tcd_tcp->rates[layno] > 0.0f)) ||
                ((cp->m_specific_param.m_enc.m_fixed_quality == 1) &&
                 (tcd_tcp->distoratio[layno] > 0.0))) {
            opj_t2_t*t2 = opj_t2_create(tcd->image, cp);
            OPJ_FLOAT64 thresh = 0;

            if (t2 == 00) {
                return OPJ_FALSE;
            }

            for (i = 0; i < 128; ++i) {
                OPJ_FLOAT64 distoachieved = 0;  /* fixed_quality */

                thresh = (lo + hi) / 2;

                opj_tcd_makelayer(tcd, layno, thresh, 0);

                if (cp->m_specific_param.m_enc.m_fixed_quality) {       /* fixed_quality */
                    if (OPJ_IS_CINEMA(cp->rsiz)) {
                        if (! opj_t2_encode_packets(t2, tcd->tcd_tileno, tcd_tile, layno + 1, dest,
                                                    p_data_written, maxlen, cstr_info, tcd->cur_tp_num, tcd->tp_pos, tcd->cur_pino,
                                                    THRESH_CALC, p_manager)) {

                            lo = thresh;
                            continue;
                        } else {
                            distoachieved = layno == 0 ?
                                            tcd_tile->distolayer[0] : cumdisto[layno - 1] + tcd_tile->distolayer[layno];

                            if (distoachieved < distotarget) {
                                hi = thresh;
                                stable_thresh = thresh;
                                continue;
                            } else {
                                lo = thresh;
                            }
                        }
                    } else {
                        distoachieved = (layno == 0) ?
                                        tcd_tile->distolayer[0] : (cumdisto[layno - 1] + tcd_tile->distolayer[layno]);

                        if (distoachieved < distotarget) {
                            hi = thresh;
                            stable_thresh = thresh;
                            continue;
                        }
                        lo = thresh;
                    }
                } else {
                    if (! opj_t2_encode_packets(t2, tcd->tcd_tileno, tcd_tile, layno + 1, dest,
                                                p_data_written, maxlen, cstr_info, tcd->cur_tp_num, tcd->tp_pos, tcd->cur_pino,
                                                THRESH_CALC, p_manager)) {
                        /* TODO: what to do with l ??? seek / tell ??? */
                        /* opj_event_msg(tcd->cinfo, EVT_INFO, "rate alloc: len=%d, max=%d\n", l, maxlen); */
                        lo = thresh;
                        continue;
                    }

                    hi = thresh;
                    stable_thresh = thresh;
                }
            }

            goodthresh = stable_thresh == 0 ? thresh : stable_thresh;

            opj_t2_destroy(t2);
        } else {
            /* Special value to indicate to use all passes */
            goodthresh = -1;
        }

        if (cstr_info) { /* Threshold for Marcela Index */
            cstr_info->tile[tcd->tcd_tileno].thresh[layno] = goodthresh;
        }

        opj_tcd_makelayer(tcd, layno, goodthresh, 1);

        /* fixed_quality */
        cumdisto[layno] = (layno == 0) ? tcd_tile->distolayer[0] :
                          (cumdisto[layno - 1] + tcd_tile->distolayer[layno]);
    }

    return OPJ_TRUE;
}